

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenStringNewSetPtr(BinaryenExpressionRef expr,BinaryenExpressionRef ptrExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef ptrExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::StringNew>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<StringNew>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x11a2,
                  "void BinaryenStringNewSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (ptrExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)ptrExpr;
    return;
  }
  __assert_fail("ptrExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x11a3,"void BinaryenStringNewSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenStringNewSetPtr(BinaryenExpressionRef expr,
                             BinaryenExpressionRef ptrExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringNew>());
  assert(ptrExpr);
  static_cast<StringNew*>(expression)->ptr = (Expression*)ptrExpr;
}